

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *__stream;
  in_addr __in;
  uint uVar1;
  int __fd;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  char *__s;
  byte bVar9;
  long lVar10;
  byte bVar11;
  bool bVar12;
  sockaddr_in sin;
  char buf [1024];
  sockaddr local_448;
  undefined1 local_438 [1032];
  
  __in.s_addr = 0x100007f;
  if (1 < argc) {
    __in.s_addr = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  uVar1 = 1;
  __fd = socket(2,1,0);
  __stream = _stderr;
  if (__fd == -1) {
    main_cold_14();
  }
  else {
    local_448.sa_family = 2;
    local_448.sa_data[0] = '\0';
    local_448.sa_data[1] = '\x16';
    local_448.sa_data._2_4_ = __in.s_addr;
    pcVar3 = inet_ntoa(__in);
    uVar1 = 0;
    fprintf(__stream,"Connecting to %s:%d as user %s\n",pcVar3,
            (ulong)(ushort)(local_448.sa_data._0_2_ << 8 | (ushort)local_448.sa_data._0_2_ >> 8),
            username);
    iVar2 = connect(__fd,&local_448,0x10);
    if (iVar2 == 0) {
      uVar1 = 0;
      lVar4 = libssh2_session_init_ex(0,0,0,0);
      if (lVar4 != 0) {
        libssh2_trace(lVar4,0xffffffff);
        uVar1 = libssh2_session_handshake(lVar4,__fd);
        if (uVar1 != 0) {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar1);
          goto LAB_001026b1;
        }
        lVar5 = libssh2_hostkey_hash(lVar4,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        lVar10 = 0;
        do {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar10));
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x14);
        fputc(10,_stderr);
        pcVar3 = username;
        sVar6 = strlen(username);
        pcVar3 = (char *)libssh2_userauth_list(lVar4,pcVar3,sVar6 & 0xffffffff);
        if (pcVar3 == (char *)0x0) {
LAB_001027d9:
          lVar5 = libssh2_channel_open_ex(lVar4,"session",7,0x200000,0x8000,0,0);
          if (lVar5 != 0) {
            libssh2_channel_setenv_ex(lVar5,"FOO",3,"bar",3);
            if (5 < argc) {
              pcVar3 = argv[5];
              sVar6 = strlen(pcVar3);
              iVar2 = libssh2_channel_process_startup(lVar5,"exec",4,pcVar3,sVar6 & 0xffffffff);
              if (iVar2 != 0) {
                main_cold_10();
                goto LAB_00102bbf;
              }
              iVar2 = libssh2_channel_eof(lVar5);
              if (iVar2 == 0) {
                do {
                  sVar6 = libssh2_channel_read_ex(lVar5,0,local_438,0x400);
                  if ((long)sVar6 < 0) {
                    fprintf(_stderr,"Unable to read response: %ld\n",sVar6);
                  }
                  else {
                    fwrite(local_438,1,sVar6,_stdout);
                  }
                  iVar2 = libssh2_channel_eof(lVar5);
                } while (iVar2 == 0);
              }
            }
            uVar1 = libssh2_channel_get_exit_status(lVar5);
            iVar2 = libssh2_channel_close(lVar5);
            if (iVar2 != 0) {
              main_cold_11();
            }
            libssh2_channel_free(lVar5);
            goto LAB_001026b1;
          }
          main_cold_12();
        }
        else {
          fprintf(_stderr,"Authentication methods: %s\n",pcVar3);
          pcVar7 = strstr(pcVar3,"password");
          bVar12 = pcVar7 != (char *)0x0;
          pcVar7 = strstr(pcVar3,"keyboard-interactive");
          bVar11 = bVar12 + 2;
          if (pcVar7 == (char *)0x0) {
            bVar11 = bVar12;
          }
          pcVar3 = strstr(pcVar3,"publickey");
          bVar9 = bVar11 + 4;
          if (pcVar3 == (char *)0x0) {
            bVar9 = bVar11;
          }
          if (4 < argc) {
            if (bVar12) {
              iVar2 = strcmp(argv[4],"-p");
              if (iVar2 == 0) {
                bVar9 = 0;
                bVar12 = true;
              }
            }
            if ((bVar9 & 2) != 0) {
              iVar2 = strcmp(argv[4],"-i");
              if (iVar2 == 0) {
                bVar9 = 2;
                bVar12 = false;
              }
            }
            if ((bVar9 & 4) != 0) {
              iVar2 = strcmp(argv[4],"-k");
              if (iVar2 == 0) {
                bVar9 = 4;
                bVar12 = false;
              }
            }
          }
          pcVar3 = username;
          if (bVar12) {
            sVar6 = strlen(username);
            pcVar7 = password;
            sVar8 = strlen(password);
            iVar2 = libssh2_userauth_password_ex
                              (lVar4,pcVar3,sVar6 & 0xffffffff,pcVar7,sVar8 & 0xffffffff,0);
            if (iVar2 == 0) {
              main_cold_3();
              goto LAB_001027d9;
            }
            main_cold_2();
          }
          else if ((bVar9 & 2) == 0) {
            if ((bVar9 & 4) == 0) {
              main_cold_9();
            }
            else {
              pcVar3 = getenv("HOME");
              if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
                pcVar3 = ".";
              }
              sVar6 = strlen(pcVar3);
              pcVar7 = (char *)malloc(sVar6 + 0x11);
              __s = (char *)malloc(sVar6 + 0xd);
              if (pcVar7 == (char *)0x0 || __s == (char *)0x0) {
                main_cold_6();
                uVar1 = 1;
                goto LAB_001026b1;
              }
              snprintf(pcVar7,sVar6 + 0x11,"%s/%s",pcVar3,".ssh/id_rsa.pub");
              snprintf(__s,sVar6 + 0xd,"%s/%s",pcVar3,".ssh/id_rsa");
              pcVar3 = username;
              sVar6 = strlen(username);
              iVar2 = libssh2_userauth_publickey_fromfile_ex
                                (lVar4,pcVar3,sVar6 & 0xffffffff,pcVar7,__s,password);
              if (iVar2 == 0) {
                main_cold_8();
                goto LAB_001027d9;
              }
              main_cold_7();
            }
          }
          else {
            sVar6 = strlen(username);
            iVar2 = libssh2_userauth_keyboard_interactive_ex
                              (lVar4,pcVar3,sVar6 & 0xffffffff,kbd_callback);
            if (iVar2 == 0) {
              main_cold_5();
              goto LAB_001027d9;
            }
            main_cold_4();
          }
        }
LAB_00102bbf:
        uVar1 = 1;
        goto LAB_001026b1;
      }
      main_cold_13();
    }
    else {
      main_cold_1();
    }
  }
  lVar4 = 0;
LAB_001026b1:
  if (lVar4 != 0) {
    libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar4);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return uVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        rc = 1;
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;

    fprintf(stderr, "Connecting to %s:%d as user %s\n",
            inet_ntoa(sin.sin_addr), ntohs(sin.sin_port), username);

    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance and start it up. This will trade welcome
     * banners, exchange keys, and setup crypto, compression, and MAC layers
     */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* Enable all debugging when libssh2 was built with debugging enabled */
    libssh2_trace(session, ~0);

    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    rc = 1;

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 4) {
            if((auth_pw & 1) && !strcmp(argv[4], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[4], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[4], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by password succeeded.\n");
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            size_t fn1sz, fn2sz;
            char *fn1, *fn2;
            char const *h = getenv("HOME");
            if(!h || !*h)
                h = ".";
            fn1sz = strlen(h) + strlen(pubkey) + 2;
            fn2sz = strlen(h) + strlen(privkey) + 2;
            fn1 = malloc(fn1sz);
            fn2 = malloc(fn2sz);
            if(!fn1 || !fn2) {
                free(fn2);
                free(fn1);
                fprintf(stderr, "out of memory\n");
                goto shutdown;
            }
            /* Avoid false positives */
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic push
#pragma GCC diagnostic warning "-Wformat-truncation=1"
#endif
            /* Using asprintf() here would be much cleaner,
               but less portable */
            snprintf(fn1, fn1sz, "%s/%s", h, pubkey);
            snprintf(fn2, fn2sz, "%s/%s", h, privkey);
#if defined(__GNUC__) && __GNUC__ >= 7
#pragma GCC diagnostic pop
#endif

            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   fn1, fn2,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                free(fn2);
                free(fn1);
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
            free(fn2);
            free(fn1);
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    /* Request a session channel on which to run a shell */
    channel = libssh2_channel_open_session(session);
    if(!channel) {
        fprintf(stderr, "Unable to open a session\n");
        goto shutdown;
    }

    /* Some environment variables may be set,
     * It's up to the server which ones it'll allow though
     */
    libssh2_channel_setenv(channel, "FOO", "bar");

    /* Request a terminal with 'vanilla' terminal emulation
     * See /etc/termcap for more options. This is useful when opening
     * an interactive shell.
     */
    #if 0
    if(libssh2_channel_request_pty(channel, "vanilla")) {
        fprintf(stderr, "Failed requesting pty\n");
    }
    #endif

    if(argc > 5) {
        if(libssh2_channel_exec(channel, argv[5])) {
            fprintf(stderr, "Unable to request command on channel\n");
            goto shutdown;
        }
        /* Instead of just running a single command with libssh2_channel_exec,
         * a shell can be opened on the channel instead, for interactive use.
         * You usually want a pty allocated first in that case (see above). */
        #if 0
        if(libssh2_channel_shell(channel)) {
            fprintf(stderr, "Unable to request shell on allocated pty\n");
            goto shutdown;
        }
        #endif

        /* At this point the shell can be interacted with using
         * libssh2_channel_read()
         * libssh2_channel_read_stderr()
         * libssh2_channel_write()
         * libssh2_channel_write_stderr()
         *
         * Blocking mode may be (en|dis)abled with:
         *    libssh2_channel_set_blocking()
         * If the server send EOF, libssh2_channel_eof() will return non-0
         * To send EOF to the server use: libssh2_channel_send_eof()
         * A channel can be closed with: libssh2_channel_close()
         * A channel can be freed with: libssh2_channel_free()
         */

        /* Read and display all the data received on stdout (ignoring stderr)
         * until the channel closes. This will eventually block if the command
         * produces too much data on stderr; the loop must be rewritten to use
         * non-blocking mode and include interspersed calls to
         * libssh2_channel_read_stderr() to avoid this. See ssh2_echo.c for
         * an idea of how such a loop might look.
         */
        while(!libssh2_channel_eof(channel)) {
            char buf[1024];
            ssize_t err = libssh2_channel_read(channel, buf, sizeof(buf));
            if(err < 0)
                fprintf(stderr, "Unable to read response: %ld\n", (long)err);
            else {
                fwrite(buf, 1, (size_t)err, stdout);
            }
        }
    }

    rc = libssh2_channel_get_exit_status(channel);

    if(libssh2_channel_close(channel))
        fprintf(stderr, "Unable to close channel\n");

    if(channel) {
        libssh2_channel_free(channel);
        channel = NULL;
    }

    /* Other channel types are supported via:
     * libssh2_scp_send64()
     * libssh2_scp_recv2()
     * libssh2_channel_direct_tcpip()
     */

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return rc;
}